

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition_table.cc
# Opt level: O0

void __thiscall
transition_table_multiple_updates_Test::TestBody(transition_table_multiple_updates_Test *this)

{
  undefined1 local_49;
  undefined1 local_48 [3];
  Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:98:9),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:99:9),_state_machine::transition::State<(anonymous_namespace)::s3>_>
  local_45;
  Table<_3b9e4afa_> local_44;
  undefined1 local_3d;
  Table<_3b9e4afa_> tb6;
  undefined1 local_31;
  Table<_61c958bf_> tb5;
  undefined1 local_27 [2];
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:88:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>_>
  tb4;
  undefined1 local_1e [3];
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>_>
  tb3;
  undefined1 local_16 [3];
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>
  local_13;
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>_>
  tb2;
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>
  tb1;
  transition_table_multiple_updates_Test *this_local;
  
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,transition_table_multiple_updates_Test::TestBody()::__0,state_machine::transition::State<(anonymous_namespace)::s2>>
            (&state_machine::placeholder::_,local_16);
  state_machine::transition::
  make_row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::__0,state_machine::transition::State<(anonymous_namespace)::s2>>>
            ((transition *)&tb2,&local_13);
  state_machine::transition::
  make_table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::__0,state_machine::transition::State<(anonymous_namespace)::s2>>>>
            ((transition *)
             &tb2.data_.
              super__Tuple_impl<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>_>
              .field_0x1,
             (Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>
              *)&tb2);
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,transition_table_multiple_updates_Test::TestBody()::__1,state_machine::containers::basic::identity<state_machine::transition::detail::empty>>
            (&state_machine::placeholder::_,local_1e);
  state_machine::transition::
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_0,state_machine::transition::State<(anonymous_namespace)::s2>>>>
  ::
  update<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::__1,state_machine::transition::State<void>>>
            ((Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>_>
              *)&tb3.data_.
                 super__Tuple_impl<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>_>
                 .
                 super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
             ,&tb2.data_.
               super__Tuple_impl<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>_>
               .field_0x1,
             (Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>
              *)&tb3);
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,transition_table_multiple_updates_Test::TestBody()::__2,state_machine::transition::State<(anonymous_namespace)::s3>>
            (&state_machine::placeholder::_,local_27);
  state_machine::transition::
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_0,state_machine::transition::State<(anonymous_namespace)::s2>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_1,state_machine::transition::State<void>>>>
  ::
  update<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::__2,state_machine::transition::State<(anonymous_namespace)::s3>>>
            ((Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>_>
              *)&tb4.data_.
                 super__Tuple_impl<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:88:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>_>
                 .
                 super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
             ,&tb3.data_.
               super__Tuple_impl<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>_>
               .
               super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
             ,(Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>
               *)&tb4.data_.
                  super__Tuple_impl<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:88:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>_>
                  .
                  super__Tuple_impl<1UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:88:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>_>
                  .field_0x1);
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,transition_table_multiple_updates_Test::TestBody()::__3,state_machine::transition::State<(anonymous_namespace)::s3>>
            (&state_machine::placeholder::_,&local_31);
  state_machine::transition::
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_0,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_2,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_1,state_machine::transition::State<void>>>>
  ::
  update<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::__3,state_machine::transition::State<(anonymous_namespace)::s3>>>
            ((Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:88:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>_>
              *)&tb5.data_.super__Tuple_impl<_2120e4dc_>.
                 super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
             ,&tb4.data_.
               super__Tuple_impl<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:88:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>_>
               .
               super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
             ,(Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:88:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>
               *)&tb5.data_.super__Tuple_impl<_2120e4dc_>.
                  super__Tuple_impl<1UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:80:34),_state_machine::transition::State<void>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:88:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:92:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:92:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>_>_>
                  .field_0x2);
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_multiple_updates_Test::TestBody()::__4,transition_table_multiple_updates_Test::TestBody()::__5,state_machine::transition::State<(anonymous_namespace)::s2>>
            (&tb6,&local_3d);
  state_machine::transition::
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_0,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_2,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_1,state_machine::transition::State<void>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_3,state_machine::transition::State<(anonymous_namespace)::s3>>>>
  ::
  update<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_multiple_updates_Test::TestBody()::__4,transition_table_multiple_updates_Test::TestBody()::__5,state_machine::transition::State<(anonymous_namespace)::s2>>>
            ((Table<_61c958bf_> *)
             ((long)&tb6.data_.super__Tuple_impl<_b8bf79bd_>.
                     super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
                     ._M_head_impl.data_.
                     super__Tuple_impl<0UL,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>
             + 1),&tb5.data_.super__Tuple_impl<_2120e4dc_>.
                   super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
             ,(Transition<state_machine::transition::State<(anonymous_namespace)::s3>,_state_machine::transition::Event<(anonymous_namespace)::e3>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:92:31),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:92:67),_state_machine::transition::State<(anonymous_namespace)::s2>_>
               *)&tb6.data_.super__Tuple_impl<_b8bf79bd_>.
                  super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
            );
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_multiple_updates_Test::TestBody()::__6,transition_table_multiple_updates_Test::TestBody()::__7,state_machine::transition::State<(anonymous_namespace)::s3>>
            (local_48,&local_49);
  state_machine::transition::
  Table<state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_0,state_machine::transition::State<(anonymous_namespace)::s2>>,state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e2>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_2,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_1,state_machine::transition::State<void>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e3>,state_machine::transition::detail::guard_always,transition_table_multiple_updates_Test::TestBody()::$_3,state_machine::transition::State<(anonymous_namespace)::s3>>>,state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_multiple_updates_Test::TestBody()::$_4,transition_table_multiple_updates_Test::TestBody()::$_5,state_machine::transition::State<(anonymous_namespace)::s2>>>>
  ::
  update<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s3>,state_machine::transition::Event<(anonymous_namespace)::e3>,transition_table_multiple_updates_Test::TestBody()::__6,transition_table_multiple_updates_Test::TestBody()::__7,state_machine::transition::State<(anonymous_namespace)::s3>>>
            (&local_44,
             (void *)((long)&tb6.data_.super__Tuple_impl<_b8bf79bd_>.
                             super__Head_base<0UL,_state_machine::transition::Row<state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>,_false>
                             ._M_head_impl.data_.
                             super__Tuple_impl<0UL,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:76:34),_state_machine::transition::State<(anonymous_namespace)::s2>_>,_state_machine::transition::Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e2>,_state_machine::transition::detail::guard_always,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_table_cc:84:34),_state_machine::transition::State<(anonymous_namespace)::s3>_>_>
                     + 1),&local_45);
  return;
}

Assistant:

TEST(transition_table, multiple_updates) {
    auto tb1 = make_table(make_row(make_transition(
        state<s1>, event<e2>, _, [] { return s2{}; }, state<s2>)));
    static_assert(decltype(tb1)::size == 1, "");

    auto tb2 = std::move(tb1).update(make_transition(
        state<s1>, event<e1>, _, [] {}, _));
    static_assert(decltype(tb2)::size == 2, "");

    auto tb3 = std::move(tb2).update(make_transition(
        state<s1>, event<e2>, _, [] { return s3{3}; }, state<s3>));
    static_assert(decltype(tb3)::size == 2, "");

    auto tb4 = std::move(tb3).update(make_transition(
        state<s1>, event<e3>, _, [](auto e) noexcept { return s3{e.value}; }, state<s3>));
    static_assert(decltype(tb4)::size == 3, "");

    auto tb5 = std::move(tb4).update(make_transition(
        state<s3>, event<e3>, [](auto e) { return e.value > 0; }, [] { return s2{}; }, state<s2>));
    static_assert(decltype(tb5)::size == 4, "");

    auto tb6 = std::move(tb5).update(make_transition(
        state<s3>,
        event<e3>,
        [](auto e) { return e.value == 0; },
        [] { return s3{0}; },
        state<s3>));
    static_assert(decltype(tb6)::size == 4, "");

    namespace tr = ::state_machine::transition;
    using FirstKey = std::decay_t<decltype(std::get<0>(tb6.data()))>::key_type;
    static_assert(std::is_same<FirstKey, tr::Key<tr::State<s1>, tr::Event<e2>>>::value, "");
}